

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O3

void __thiscall QRingBuffer::chop(QRingBuffer *this,qint64 bytes)

{
  QRingChunk *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  long lVar4;
  iterator iVar5;
  long lVar6;
  
  if (0 < bytes) {
    do {
      lVar4 = (this->buffers).d.size;
      if (lVar4 == 1) {
LAB_00127277:
        iVar5 = QList<QRingChunk>::end(&this->buffers);
        lVar4 = this->bufferSize - bytes;
        if (lVar4 != 0) {
          iVar5.i[-1].tailOffset = iVar5.i[-1].tailOffset - bytes;
          this->bufferSize = lVar4;
          return;
        }
        if (((iVar5.i[-1].chunk.d.size <= (long)this->basicBlockSize) &&
            (pDVar3 = iVar5.i[-1].chunk.d.d, pDVar3 != (Data *)0x0)) &&
           ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> == 1)) {
          iVar5.i[-1].headOffset = 0;
          iVar5.i[-1].tailOffset = 0;
          this->bufferSize = 0;
          return;
        }
        clear(this);
        return;
      }
      pQVar1 = (this->buffers).d.ptr;
      lVar4 = pQVar1[lVar4 + -1].tailOffset - pQVar1[lVar4 + -1].headOffset;
      lVar6 = bytes - lVar4;
      if (bytes < lVar4) goto LAB_00127277;
      this->bufferSize = this->bufferSize - lVar4;
      pDVar2 = (this->buffers).d.d;
      if ((pDVar2 == (Data *)0x0) ||
         (1 < (__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
        QArrayDataPointer<QRingChunk>::reallocateAndGrow
                  ((QArrayDataPointer<QRingChunk> *)this,GrowsAtEnd,0,
                   (QArrayDataPointer<QRingChunk> *)0x0);
      }
      QtPrivate::QGenericArrayOps<QRingChunk>::eraseLast((QGenericArrayOps<QRingChunk> *)this);
      bytes = lVar6;
    } while (0 < lVar6);
  }
  return;
}

Assistant:

void QRingBuffer::chop(qint64 bytes)
{
    Q_ASSERT(bytes <= bufferSize);

    while (bytes > 0) {
        const qsizetype chunkSize = buffers.constLast().size();

        if (buffers.size() == 1 || chunkSize > bytes) {
            QRingChunk &chunk = buffers.last();
            // keep a single block around if it does not exceed
            // the basic block size, to avoid repeated allocations
            // between uses of the buffer
            if (bufferSize == bytes) {
                if (chunk.capacity() <= basicBlockSize && !chunk.isShared()) {
                    chunk.reset();
                    bufferSize = 0;
                } else {
                    clear(); // try to minify/squeeze us
                }
            } else {
                Q_ASSERT(bytes < QByteArray::maxSize());
                chunk.grow(-bytes);
                bufferSize -= bytes;
            }
            return;
        }

        bufferSize -= chunkSize;
        bytes -= chunkSize;
        buffers.removeLast();
    }
}